

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O2

int u8_utf8toucs2(uint16_t *dest,int sz,char *src,int srcsz)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  short sVar5;
  ulong uVar7;
  byte *pbVar8;
  ushort uVar9;
  ushort uVar10;
  ulong uVar4;
  short sVar6;
  
  pbVar8 = (byte *)(src + srcsz);
  iVar3 = 1;
  if (1 < sz) {
    iVar3 = sz;
  }
  uVar4 = (ulong)(iVar3 - 1);
  uVar7 = 0;
  do {
    if (uVar4 == uVar7) {
LAB_001719b7:
      dest[uVar4] = 0;
      return (int)uVar4;
    }
    bVar1 = *src;
    uVar9 = (ushort)bVar1;
    bVar2 = ""[bVar1];
    if (srcsz == -1) {
      if (bVar1 == 0) goto LAB_001719b5;
    }
    else if (pbVar8 <= (byte *)src + (char)bVar2) {
LAB_001719b5:
      uVar4 = uVar7 & 0xffffffff;
      goto LAB_001719b7;
    }
    sVar6 = 0;
    sVar5 = 0;
    switch(bVar2) {
    case 0:
      uVar10 = (ushort)bVar2;
      break;
    case 3:
      sVar6 = (ushort)bVar1 << 6;
      uVar9 = (ushort)((byte *)src)[1];
      src = (char *)((byte *)src + 1);
    case 2:
      sVar6 = (uVar9 + sVar6) * 0x40;
      uVar9 = (ushort)((byte *)src)[1];
      src = (char *)((byte *)src + 1);
    case 1:
      uVar10 = (uVar9 + sVar6) * 0x40;
      uVar9 = (ushort)((byte *)src)[1];
      src = (char *)((byte *)src + 1);
      break;
    default:
      goto switchD_0017195e_default;
    }
    src = (char *)((byte *)src + 1);
    sVar5 = uVar9 + uVar10;
switchD_0017195e_default:
    dest[uVar7] = sVar5 - (short)offsetsFromUTF8[(char)bVar2];
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int u8_utf8toucs2(uint16_t *dest, int sz, const char *src, int srcsz)
{
    uint16_t ch;
    const char *src_end = src + srcsz;
    int nb;
    int i=0;

    while (i < sz-1) {
        nb = trailingBytesForUTF8[(unsigned char)*src];
        if (srcsz == -1) {
            if (*src == 0)
                goto done_toucs;
        }
        else {
            if (src + nb >= src_end)
                goto done_toucs;
        }
        ch = 0;
        switch (nb) {
        case 3: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 2: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 1: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 0: ch += (unsigned char)*src++; /* falls through */
        }
        ch -= offsetsFromUTF8[nb];
        dest[i++] = ch;
    }
 done_toucs:
    dest[i] = 0;
    return i;
}